

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint _c;
  undefined4 uVar4;
  Mat *pMVar5;
  undefined4 uVar7;
  size_t sVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  size_t *psVar12;
  undefined4 *puVar13;
  int *piVar14;
  pointer pMVar15;
  pointer pMVar16;
  byte bVar17;
  int iVar18;
  undefined4 *puVar19;
  long lVar20;
  ulong uVar21;
  pointer pMVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  undefined4 *puVar26;
  long lVar27;
  int iVar28;
  undefined4 *puVar29;
  undefined4 *puVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  void *pvVar35;
  uint uVar36;
  size_t sVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  bool bVar42;
  int local_d0;
  Mat local_80;
  uint local_38;
  uint local_34;
  
  pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar1 = pMVar16->dims;
  iVar18 = (this->super_Concat).axis;
  if (uVar1 == 1) {
    lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar16;
    if (lVar20 == 0) {
      uVar23 = 0;
    }
    else {
      lVar20 = (lVar20 >> 3) * -0x71c71c71c71c71c7;
      lVar20 = lVar20 + (ulong)(lVar20 == 0);
      piVar14 = &pMVar16->w;
      uVar23 = 0;
      do {
        uVar23 = uVar23 + piVar14[-5] * *piVar14;
        piVar14 = piVar14 + 0x12;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    bVar17 = (uVar23 & 3) == 0 & opt->use_packing_layout;
    iVar28 = (uint)bVar17 + (uint)bVar17 * 2 + 1;
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,(int)uVar23 / iVar28,
                pMVar16->elemsize / (ulong)(long)pMVar16->elempack << bVar17 * '\x02',iVar28,
                opt->blob_allocator);
    pvVar35 = pMVar5->data;
    if (pvVar35 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar5->c * pMVar5->cstep == 0) {
      return -100;
    }
    pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar16) {
      lVar20 = 0x2c;
      uVar38 = 0;
      do {
        memcpy(pvVar35,*(void **)((long)pMVar16 + lVar20 + -0x2c),
               (long)*(int *)((long)&pMVar16->data + lVar20) *
               *(long *)((long)pMVar16 + lVar20 + -0x1c));
        pvVar35 = (void *)((long)pvVar35 +
                          (long)*(int *)((long)pMVar16 + lVar20 + -0x14) *
                          (long)*(int *)((long)&pMVar16->data + lVar20) * 4);
        uVar38 = uVar38 + 1;
        pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x48;
      } while (uVar38 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >>
                                3) * -0x71c71c71c71c71c7));
    }
  }
  uVar23 = (iVar18 >> 0x1f & uVar1) + iVar18;
  if ((uVar1 == 2) && (uVar23 == 0)) {
    iVar18 = pMVar16->w;
    sVar37 = pMVar16->elemsize;
    iVar28 = pMVar16->elempack;
    lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar16;
    if (lVar20 == 0) {
      uVar36 = 0;
    }
    else {
      lVar20 = (lVar20 >> 3) * -0x71c71c71c71c71c7;
      lVar20 = lVar20 + (ulong)(lVar20 == 0);
      piVar14 = &pMVar16->h;
      uVar36 = 0;
      do {
        if (*(ulong *)(piVar14 + -8) < sVar37) {
          sVar37 = *(ulong *)(piVar14 + -8);
        }
        iVar25 = piVar14[-6];
        if (iVar25 < iVar28) {
          iVar28 = iVar25;
        }
        uVar36 = uVar36 + iVar25 * *piVar14;
        piVar14 = piVar14 + 0x12;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    bVar17 = (uVar36 & 3) == 0 & opt->use_packing_layout;
    iVar25 = (uint)bVar17 + (uint)bVar17 * 2 + 1;
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,iVar18,(int)uVar36 / iVar25,sVar37 / (ulong)(long)iVar28 << bVar17 * '\x02',
                iVar25,opt->blob_allocator);
    local_80.data = pMVar5->data;
    if ((undefined4 *)local_80.data == (undefined4 *)0x0) {
      return -100;
    }
    local_80.cstep = pMVar5->cstep;
    local_80.c = pMVar5->c;
    if (local_80.cstep * (long)local_80.c == 0) {
      return -100;
    }
    local_80.refcount = pMVar5->refcount;
    local_80.elemsize = pMVar5->elemsize;
    local_80.elempack = pMVar5->elempack;
    local_80.allocator = pMVar5->allocator;
    uVar8 = pMVar5->dims;
    uVar9 = pMVar5->w;
    uVar10 = pMVar5->h;
    uVar11 = pMVar5->d;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    local_80.dims = uVar8;
    local_80.w = uVar9;
    local_80.h = uVar10;
    local_80.d = uVar11;
    if ((iVar25 <= iVar28) ||
       ((Mat::create(&local_80,iVar18,(int)uVar36 / iVar28,sVar37,iVar28,opt->workspace_allocator),
        (undefined4 *)local_80.data != (undefined4 *)0x0 && ((long)local_80.c * local_80.cstep != 0)
        ))) {
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pMVar15 != pMVar16) {
        lVar20 = (long)iVar18;
        uVar38 = 0;
        puVar13 = (undefined4 *)local_80.data;
        do {
          pMVar22 = pMVar16 + uVar38;
          iVar33 = pMVar22->elempack;
          if (((iVar33 == 4) && (iVar28 == 1)) && (iVar32 = pMVar22->h, 0 < (long)iVar32)) {
            pvVar35 = pMVar22->data;
            iVar2 = pMVar22->w;
            sVar37 = pMVar22->elemsize;
            lVar27 = 0;
            do {
              if (0 < iVar18) {
                puVar29 = (undefined4 *)((long)iVar2 * sVar37 * lVar27 + (long)pvVar35);
                puVar19 = puVar13;
                iVar31 = iVar18;
                do {
                  *puVar19 = *puVar29;
                  puVar19[lVar20] = puVar29[1];
                  puVar19[iVar18 * 2] = puVar29[2];
                  puVar19[iVar18 * 3] = puVar29[3];
                  puVar19 = puVar19 + 1;
                  puVar29 = puVar29 + 4;
                  iVar31 = iVar31 + -1;
                } while (iVar31 != 0);
              }
              puVar13 = puVar13 + lVar20 * 4;
              lVar27 = lVar27 + 1;
            } while (lVar27 != iVar32);
          }
          if (iVar33 == iVar28) {
            lVar27 = pMVar22->h * lVar20;
            memcpy(puVar13,pMVar22->data,pMVar22->elemsize * lVar27);
            local_d0 = (int)lVar27;
            puVar13 = puVar13 + (long)local_d0 * (long)pMVar22->elempack;
            pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 < (ulong)(((long)pMVar15 - (long)pMVar16 >> 3) * -0x71c71c71c71c71c7));
      }
      if (iVar28 < iVar25) {
        convert_packing(&local_80,pMVar5,iVar25,opt);
      }
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount == 0) {
          if (local_80.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
              free(local_80.data);
            }
          }
          else {
            (*(local_80.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_001448cb;
    }
    if (local_80.refcount == (int *)0x0) {
      return -100;
    }
    LOCK();
    *local_80.refcount = *local_80.refcount + -1;
    UNLOCK();
    if (*local_80.refcount != 0) {
      return -100;
    }
    if (local_80.allocator != (Allocator *)0x0) {
      (*(local_80.allocator)->_vptr_Allocator[3])();
      return -100;
    }
joined_r0x00145480:
    iVar18 = -100;
    if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
      local_80.allocator = (Allocator *)0x0;
      iVar18 = -100;
      free(local_80.data);
    }
  }
  else {
LAB_001448cb:
    if ((uVar1 == 2) && (uVar23 == 1)) {
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar36 = pMVar16->h;
      sVar37 = pMVar16->elemsize;
      iVar18 = pMVar16->elempack;
      lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
      if (lVar20 == 0) {
        iVar28 = 0;
      }
      else {
        lVar20 = (lVar20 >> 3) * -0x71c71c71c71c71c7;
        lVar20 = lVar20 + (ulong)(lVar20 == 0);
        piVar14 = &pMVar16->w;
        iVar28 = 0;
        do {
          iVar28 = iVar28 + *piVar14;
          piVar14 = piVar14 + 0x12;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,iVar28,uVar36,sVar37,iVar18,opt->blob_allocator);
      if (pMVar5->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar5->c * pMVar5->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar36) {
        uVar38 = 0;
        pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          pMVar22 = pMVar16;
          if (pMVar15 != pMVar16) {
            pvVar35 = (void *)((long)pMVar5->w * uVar38 * pMVar5->elemsize + (long)pMVar5->data);
            lVar20 = 0x2c;
            uVar39 = 0;
            do {
              lVar27 = (long)*(int *)((long)&pMVar22->data + lVar20);
              memcpy(pvVar35,(void *)(uVar38 * lVar27 * *(long *)((long)pMVar22 + lVar20 + -0x1c) +
                                     *(long *)((long)pMVar22 + lVar20 + -0x2c)),lVar27 * sVar37);
              pvVar35 = (void *)((long)pvVar35 +
                                (long)*(int *)((long)&pMVar22->data + lVar20) * (long)iVar18 * 4);
              uVar39 = uVar39 + 1;
              pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              lVar20 = lVar20 + 0x48;
            } while (uVar39 < (ulong)(((long)pMVar16 - (long)pMVar22 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar38 = uVar38 + 1;
          pMVar15 = pMVar16;
          pMVar16 = pMVar22;
        } while (uVar38 != uVar36);
      }
    }
    if ((uVar1 - 3 < 2) && (uVar23 == 0)) {
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar18 = pMVar16->w;
      iVar28 = pMVar16->h;
      iVar25 = pMVar16->d;
      sVar37 = pMVar16->elemsize;
      iVar33 = pMVar16->elempack;
      lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
      if (lVar20 == 0) {
        uVar36 = 0;
      }
      else {
        lVar20 = (lVar20 >> 3) * -0x71c71c71c71c71c7;
        lVar20 = lVar20 + (ulong)(lVar20 == 0);
        psVar12 = &pMVar16->elemsize;
        uVar36 = 0;
        do {
          if (*psVar12 < sVar37) {
            sVar37 = *psVar12;
          }
          iVar32 = *(int *)(psVar12 + 1);
          if (iVar32 < iVar33) {
            iVar33 = iVar32;
          }
          uVar36 = uVar36 + iVar32 * *(int *)(psVar12 + 5);
          psVar12 = psVar12 + 9;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      bVar17 = (uVar36 & 3) == 0 & opt->use_packing_layout;
      iVar32 = (uint)bVar17 + (uint)bVar17 * 2 + 1;
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,iVar18,iVar28,iVar25,(int)uVar36 / iVar32,
                  sVar37 / (ulong)(long)iVar33 << bVar17 * '\x02',iVar32,opt->blob_allocator);
      local_80.data = pMVar5->data;
      if ((undefined4 *)local_80.data == (undefined4 *)0x0) {
        return -100;
      }
      local_80.cstep = pMVar5->cstep;
      local_80.c = pMVar5->c;
      if (local_80.cstep * (long)local_80.c == 0) {
        return -100;
      }
      pMVar5->dims = uVar1;
      local_80.refcount = pMVar5->refcount;
      local_80.elemsize = pMVar5->elemsize;
      local_80.elempack = pMVar5->elempack;
      local_80.allocator = pMVar5->allocator;
      uVar4 = pMVar5->w;
      uVar7 = pMVar5->h;
      local_80.d = pMVar5->d;
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + 1;
        UNLOCK();
      }
      local_80.w = uVar4;
      local_80.h = uVar7;
      if ((iVar33 < iVar32) &&
         ((local_80.dims = uVar1,
          Mat::create(&local_80,iVar18,iVar28,iVar25,(int)uVar36 / iVar33,sVar37,iVar33,
                      opt->workspace_allocator), (undefined4 *)local_80.data == (undefined4 *)0x0 ||
          ((long)local_80.c * local_80.cstep == 0)))) {
        if (local_80.refcount == (int *)0x0) {
          return -100;
        }
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount != 0) {
          return -100;
        }
        if (local_80.allocator != (Allocator *)0x0) {
          (*(local_80.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto joined_r0x00145480;
      }
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      local_80.dims = uVar1;
      if (pMVar15 != pMVar16) {
        uVar39 = 0;
        uVar38 = 0;
        do {
          pMVar22 = pMVar16 + uVar38;
          iVar18 = pMVar22->elempack;
          if (((iVar18 == 4) && (iVar33 == 1)) && (iVar28 = pMVar22->c, 0 < (long)iVar28)) {
            iVar25 = pMVar22->h * pMVar22->w * pMVar22->d;
            sVar37 = pMVar22->cstep;
            sVar6 = pMVar22->elemsize;
            pvVar35 = pMVar22->data;
            lVar27 = local_80.cstep * local_80.elemsize;
            uVar39 = (ulong)(int)uVar39;
            puVar29 = (undefined4 *)((uVar39 + 3) * lVar27 + (long)local_80.data);
            puVar19 = (undefined4 *)((uVar39 + 2) * lVar27 + (long)local_80.data);
            puVar13 = (undefined4 *)((uVar39 + 1) * lVar27 + (long)local_80.data);
            puVar30 = (undefined4 *)(lVar27 * uVar39 + (long)local_80.data);
            lVar20 = 0;
            do {
              if (0 < iVar25) {
                puVar26 = (undefined4 *)(sVar37 * sVar6 * lVar20 + (long)pvVar35);
                lVar40 = 0;
                do {
                  puVar30[lVar40] = *puVar26;
                  puVar13[lVar40] = puVar26[1];
                  puVar19[lVar40] = puVar26[2];
                  puVar29[lVar40] = puVar26[3];
                  puVar26 = puVar26 + 4;
                  lVar40 = lVar40 + 1;
                } while (iVar25 != (int)lVar40);
              }
              uVar39 = uVar39 + 4;
              lVar20 = lVar20 + 1;
              puVar29 = puVar29 + lVar27;
              puVar19 = puVar19 + lVar27;
              puVar13 = puVar13 + lVar27;
              puVar30 = puVar30 + lVar27;
            } while (lVar20 != iVar28);
          }
          if (iVar18 == iVar33) {
            memcpy((undefined4 *)
                   (local_80.cstep * (long)(int)uVar39 * local_80.elemsize + (long)local_80.data),
                   pMVar22->data,(long)((int)pMVar22->cstep * pMVar22->c) * pMVar22->elemsize);
            uVar39 = (ulong)(uint)((int)uVar39 + pMVar22->c);
            pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 < (ulong)(((long)pMVar15 - (long)pMVar16 >> 3) * -0x71c71c71c71c71c7));
      }
      if (iVar33 < iVar32) {
        convert_packing(&local_80,pMVar5,iVar32,opt);
      }
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount == 0) {
          if (local_80.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
              free(local_80.data);
            }
          }
          else {
            (*(local_80.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    local_34 = uVar1 ^ 4;
    local_38 = uVar23 ^ 2;
    if ((uVar23 == 1 && uVar1 == 3) || (local_34 == 0 && local_38 == 0)) {
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar36 = pMVar16->d;
      uVar3 = pMVar16->c;
      sVar37 = pMVar16->elemsize;
      iVar18 = pMVar16->elempack;
      lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
      if (lVar20 == 0) {
        iVar28 = 0;
      }
      else {
        lVar20 = (lVar20 >> 3) * -0x71c71c71c71c71c7;
        lVar20 = lVar20 + (ulong)(lVar20 == 0);
        piVar14 = &pMVar16->h;
        iVar28 = 0;
        do {
          iVar28 = iVar28 + *piVar14;
          piVar14 = piVar14 + 0x12;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,pMVar16->w,iVar28,uVar36,uVar3,sVar37,iVar18,opt->blob_allocator);
      if (pMVar5->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar5->c * pMVar5->cstep == 0) {
        return -100;
      }
      pMVar5->dims = uVar1;
      if (0 < (int)uVar3) {
        uVar38 = 0;
        do {
          if (0 < (int)uVar36) {
            pvVar35 = (void *)(pMVar5->cstep * uVar38 * pMVar5->elemsize + (long)pMVar5->data);
            pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            uVar39 = 0;
            do {
              bVar42 = pMVar16 != pMVar15;
              pMVar16 = pMVar15;
              if (bVar42) {
                lVar20 = 0x40;
                uVar21 = 0;
                do {
                  lVar40 = (long)*(int *)((long)pMVar15 + lVar20 + -0x14);
                  lVar24 = (long)*(int *)((long)pMVar15 + lVar20 + -0x10);
                  lVar27 = *(long *)((long)pMVar15 + lVar20 + -0x30);
                  lVar34 = lVar24 * lVar40;
                  memcpy(pvVar35,(void *)(lVar27 * lVar24 * uVar39 * lVar40 +
                                         *(long *)((long)&pMVar15->data + lVar20) * uVar38 * lVar27
                                         + *(long *)((long)pMVar15 + lVar20 + -0x40)),
                         lVar34 * sVar37);
                  pvVar35 = (void *)((long)pvVar35 + (long)((int)lVar34 * iVar18) * 4);
                  uVar21 = uVar21 + 1;
                  pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                  lVar20 = lVar20 + 0x48;
                } while (uVar21 < (ulong)(((long)pMVar16 - (long)pMVar15 >> 3) * -0x71c71c71c71c71c7
                                         ));
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 != uVar36);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar3);
      }
    }
    local_34 = local_34 | uVar23 ^ 3;
    if ((uVar1 == 3 && local_38 == 0) || (local_34 == 0)) {
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar36 = pMVar16->h;
      uVar3 = pMVar16->d;
      _c = pMVar16->c;
      sVar37 = pMVar16->elemsize;
      iVar18 = pMVar16->elempack;
      lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
      if (lVar20 == 0) {
        iVar28 = 0;
      }
      else {
        lVar20 = (lVar20 >> 3) * -0x71c71c71c71c71c7;
        lVar20 = lVar20 + (ulong)(lVar20 == 0);
        piVar14 = &pMVar16->w;
        iVar28 = 0;
        do {
          iVar28 = iVar28 + *piVar14;
          piVar14 = piVar14 + 0x12;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,iVar28,uVar36,uVar3,_c,sVar37,iVar18,opt->blob_allocator);
      if (pMVar5->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar5->c * pMVar5->cstep == 0) {
        return -100;
      }
      pMVar5->dims = uVar1;
      if (0 < (int)_c) {
        uVar38 = 0;
        do {
          if (0 < (int)uVar3) {
            pvVar35 = (void *)(pMVar5->cstep * uVar38 * pMVar5->elemsize + (long)pMVar5->data);
            uVar39 = 0;
            do {
              if (0 < (int)uVar36) {
                uVar21 = 0;
                pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
                pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  pMVar22 = pMVar16;
                  if (pMVar15 != pMVar16) {
                    lVar20 = 0x40;
                    uVar41 = 0;
                    do {
                      lVar40 = (long)*(int *)((long)pMVar22 + lVar20 + -0x14);
                      lVar27 = *(long *)((long)pMVar22 + lVar20 + -0x30);
                      lVar24 = lVar27 * lVar40;
                      memcpy(pvVar35,(void *)(lVar24 * uVar21 +
                                              (long)*(int *)((long)pMVar22 + lVar20 + -0x10) *
                                              uVar39 * lVar24 +
                                             *(long *)((long)&pMVar22->data + lVar20) * uVar38 *
                                             lVar27 + *(long *)((long)pMVar22 + lVar20 + -0x40)),
                             lVar40 * sVar37);
                      pvVar35 = (void *)((long)pvVar35 +
                                        (long)*(int *)((long)pMVar22 + lVar20 + -0x14) *
                                        (long)iVar18 * 4);
                      uVar41 = uVar41 + 1;
                      pMVar22 = (bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                      pMVar16 = (bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish;
                      lVar20 = lVar20 + 0x48;
                    } while (uVar41 < (ulong)(((long)pMVar16 - (long)pMVar22 >> 3) *
                                             -0x71c71c71c71c71c7));
                  }
                  uVar21 = uVar21 + 1;
                  pMVar15 = pMVar16;
                  pMVar16 = pMVar22;
                } while (uVar21 != uVar36);
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 != uVar3);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != _c);
      }
    }
    iVar18 = 0;
    if ((uVar1 == 4) && (uVar23 == 1)) {
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar1 = pMVar16->c;
      sVar37 = pMVar16->elemsize;
      iVar28 = pMVar16->elempack;
      lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
      if (lVar20 == 0) {
        iVar18 = 0;
      }
      else {
        lVar20 = (lVar20 >> 3) * -0x71c71c71c71c71c7;
        lVar20 = lVar20 + (ulong)(lVar20 == 0);
        piVar14 = &pMVar16->d;
        iVar18 = 0;
        do {
          iVar18 = iVar18 + *piVar14;
          piVar14 = piVar14 + 0x12;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,pMVar16->w,pMVar16->h,iVar18,uVar1,sVar37,iVar28,opt->blob_allocator);
      iVar18 = -100;
      if ((pMVar5->data != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
        if ((int)uVar1 < 1) {
          iVar18 = 0;
        }
        else {
          pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar38 = 0;
          do {
            bVar42 = pMVar16 != pMVar15;
            pMVar16 = pMVar15;
            if (bVar42) {
              pvVar35 = (void *)(pMVar5->cstep * uVar38 * pMVar5->elemsize + (long)pMVar5->data);
              lVar20 = 0x40;
              uVar39 = 0;
              do {
                lVar27 = (long)*(int *)((long)pMVar15 + lVar20 + -0xc) *
                         (long)*(int *)((long)pMVar15 + lVar20 + -0x10) *
                         (long)*(int *)((long)pMVar15 + lVar20 + -0x14);
                memcpy(pvVar35,(void *)(*(long *)((long)&pMVar15->data + lVar20) * uVar38 *
                                        *(long *)((long)pMVar15 + lVar20 + -0x30) +
                                       *(long *)((long)pMVar15 + lVar20 + -0x40)),lVar27 * sVar37);
                pvVar35 = (void *)((long)pvVar35 + (long)((int)lVar27 * iVar28) * 4);
                uVar39 = uVar39 + 1;
                pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
                lVar20 = lVar20 + 0x48;
              } while (uVar39 < (ulong)(((long)pMVar16 - (long)pMVar15 >> 3) * -0x71c71c71c71c71c7))
              ;
            }
            uVar38 = uVar38 + 1;
            iVar18 = 0;
          } while (uVar38 != uVar1);
        }
      }
    }
  }
  return iVar18;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, d, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;

            top_blob_unpacked.dims = dims;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const float* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elempack;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const float* ptr = bottom_blob.channel(q).depth(i).row(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elempack;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    return 0;
}